

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O1

void __thiscall leveldb::MemTable::~MemTable(MemTable *this)

{
  if (this->refs_ == 0) {
    Comparator::~Comparator((Comparator *)&this->table_);
    Arena::~Arena(&this->arena_);
    Comparator::~Comparator((Comparator *)this);
    return;
  }
  __assert_fail("refs_ == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/memtable.cc"
                ,0x18,"leveldb::MemTable::~MemTable()");
}

Assistant:

MemTable::~MemTable() { assert(refs_ == 0); }